

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

void __thiscall helics::apps::Tracer::loadTextFile(Tracer *this,string *textFile)

{
  string_view captureDesc;
  string_view delimiters;
  string_view line;
  string_view quoteChars;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view endpoint;
  string_view sourceEndpoint;
  string_view destEndpoint;
  string_view sourceEndpoint_00;
  string_view destEndpoint_00;
  string_view sourceEndpoint_01;
  string_view destEndpoint_01;
  string_view key;
  string_view key_00;
  bool bVar1;
  istream *piVar2;
  reference pvVar3;
  size_type sVar4;
  ostream *poVar5;
  string *in_RSI;
  stringVector blk;
  size_type firstChar;
  int lineCount;
  string str;
  ifstream infile;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  char *in_stack_fffffffffffffa28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  ostream *in_stack_fffffffffffffa38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  ostream *in_stack_fffffffffffffa50;
  ostream *in_stack_fffffffffffffa58;
  Tracer *in_stack_fffffffffffffa60;
  ostream *in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa74;
  undefined1 in_stack_fffffffffffffa75;
  undefined1 in_stack_fffffffffffffa76;
  undefined1 in_stack_fffffffffffffa77;
  Tracer *in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa99;
  undefined1 in_stack_fffffffffffffa9a;
  undefined1 in_stack_fffffffffffffa9b;
  undefined1 in_stack_fffffffffffffa9c;
  undefined1 in_stack_fffffffffffffa9d;
  undefined1 in_stack_fffffffffffffa9e;
  undefined1 in_stack_fffffffffffffa9f;
  undefined1 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa1;
  undefined1 in_stack_fffffffffffffaa2;
  undefined1 in_stack_fffffffffffffaa3;
  undefined1 in_stack_fffffffffffffaa4;
  undefined1 in_stack_fffffffffffffaa5;
  undefined1 in_stack_fffffffffffffaa6;
  undefined1 in_stack_fffffffffffffaa7;
  undefined1 in_stack_fffffffffffffcc8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  size_type local_258;
  int local_23c;
  string local_238 [32];
  istream local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  App::loadTextFile(in_stack_fffffffffffffcc8._8_8_,in_stack_fffffffffffffcc8._0_8_);
  std::ifstream::ifstream(local_218,local_10,_S_in);
  std::__cxx11::string::string(in_stack_fffffffffffffa30);
  local_23c = 0;
  do {
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_238);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) {
        std::ifstream::close();
        std::__cxx11::string::~string(in_stack_fffffffffffffa20);
        std::ifstream::~ifstream(local_218);
        return;
      }
      local_23c = local_23c + 1;
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x413593);
    } while ((((bVar1) ||
              (local_258 = CLI::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           find_first_not_of(in_stack_fffffffffffffa40,
                                             (char *)in_stack_fffffffffffffa38,
                                             (size_type)in_stack_fffffffffffffa30),
              local_258 == 0xffffffffffffffff)) ||
             (pvVar3 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_stack_fffffffffffffa20,
                                  CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)),
             *pvVar3 == '#')) ||
            (pvVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (in_stack_fffffffffffffa20,
                                 CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)),
            *pvVar3 == '!'));
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa30,
               in_stack_fffffffffffffa28);
    in_stack_fffffffffffffa18 = 3;
    in_stack_fffffffffffffa1c = 0;
    in_stack_fffffffffffffa20 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x80670e;
    line._M_str = (char *)in_stack_fffffffffffffa38;
    line._M_len = (size_t)in_stack_fffffffffffffa30;
    delimiters._M_str = in_stack_fffffffffffffa28;
    delimiters._M_len = (size_t)"\'\"`";
    quoteChars._M_str = (char *)in_stack_fffffffffffffa58;
    quoteChars._M_len = (size_t)in_stack_fffffffffffffa50;
    gmlc::utilities::stringOps::splitlineQuotes_abi_cxx11_(line,delimiters,quoteChars,on);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_270);
    if (sVar4 == 1) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_270,0);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
      str_00._M_str = (char *)in_stack_fffffffffffffa68;
      str_00._M_len = (size_t)in_stack_fffffffffffffa60;
      gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_00);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
      key._M_len._1_1_ = in_stack_fffffffffffffa99;
      key._M_len._0_1_ = in_stack_fffffffffffffa98;
      key._M_len._2_1_ = in_stack_fffffffffffffa9a;
      key._M_len._3_1_ = in_stack_fffffffffffffa9b;
      key._M_len._4_1_ = in_stack_fffffffffffffa9c;
      key._M_len._5_1_ = in_stack_fffffffffffffa9d;
      key._M_len._6_1_ = in_stack_fffffffffffffa9e;
      key._M_len._7_1_ = in_stack_fffffffffffffa9f;
      key._M_str._0_1_ = in_stack_fffffffffffffaa0;
      key._M_str._1_1_ = in_stack_fffffffffffffaa1;
      key._M_str._2_1_ = in_stack_fffffffffffffaa2;
      key._M_str._3_1_ = in_stack_fffffffffffffaa3;
      key._M_str._4_1_ = in_stack_fffffffffffffaa4;
      key._M_str._5_1_ = in_stack_fffffffffffffaa5;
      key._M_str._6_1_ = in_stack_fffffffffffffaa6;
      key._M_str._7_1_ = in_stack_fffffffffffffaa7;
      addSubscription(in_stack_fffffffffffffa90,key);
      std::__cxx11::string::~string(in_stack_fffffffffffffa20);
    }
    else if (sVar4 == 2) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_270,0);
      in_stack_fffffffffffffaa7 =
           std::operator==(in_stack_fffffffffffffa20,
                           (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      if (!(bool)in_stack_fffffffffffffaa7) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_270,0);
        in_stack_fffffffffffffaa6 =
             std::operator==(in_stack_fffffffffffffa20,
                             (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
        if (!(bool)in_stack_fffffffffffffaa6) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_270,0);
          in_stack_fffffffffffffaa5 =
               std::operator==(in_stack_fffffffffffffa20,
                               (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)
                              );
          if (!(bool)in_stack_fffffffffffffaa5) {
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_270,0);
            in_stack_fffffffffffffaa4 =
                 std::operator==(in_stack_fffffffffffffa20,
                                 (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                  in_stack_fffffffffffffa18));
            if (!(bool)in_stack_fffffffffffffaa4) {
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_270,0);
              in_stack_fffffffffffffaa3 =
                   std::operator==(in_stack_fffffffffffffa20,
                                   (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                    in_stack_fffffffffffffa18));
              if (!(bool)in_stack_fffffffffffffaa3) {
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_270,0);
                in_stack_fffffffffffffaa2 =
                     std::operator==(in_stack_fffffffffffffa20,
                                     (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                      in_stack_fffffffffffffa18));
                if (!(bool)in_stack_fffffffffffffaa2) {
                  CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_270,0);
                  in_stack_fffffffffffffaa1 =
                       std::operator==(in_stack_fffffffffffffa20,
                                       (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                        in_stack_fffffffffffffa18));
                  if (!(bool)in_stack_fffffffffffffaa1) {
                    CLI::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_270,0);
                    in_stack_fffffffffffffaa0 =
                         std::operator==(in_stack_fffffffffffffa20,
                                         (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                          in_stack_fffffffffffffa18));
                    if (!(bool)in_stack_fffffffffffffaa0) {
                      CLI::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_270,0);
                      in_stack_fffffffffffffa9f =
                           std::operator==(in_stack_fffffffffffffa20,
                                           (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                            in_stack_fffffffffffffa18));
                      if (!(bool)in_stack_fffffffffffffa9f) {
                        CLI::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_270,0);
                        in_stack_fffffffffffffa9e =
                             std::operator==(in_stack_fffffffffffffa20,
                                             (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                              in_stack_fffffffffffffa18));
                        if (!(bool)in_stack_fffffffffffffa9e) {
                          CLI::std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&local_270,0);
                          in_stack_fffffffffffffa9d =
                               std::operator==(in_stack_fffffffffffffa20,
                                               (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                in_stack_fffffffffffffa18));
                          if (!(bool)in_stack_fffffffffffffa9d) {
                            CLI::std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&local_270,0);
                            in_stack_fffffffffffffa9c =
                                 std::operator==(in_stack_fffffffffffffa20,
                                                 (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                  in_stack_fffffffffffffa18));
                            if (!(bool)in_stack_fffffffffffffa9c) {
                              CLI::std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&local_270,0);
                              in_stack_fffffffffffffa9b =
                                   std::operator==(in_stack_fffffffffffffa20,
                                                   (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                    in_stack_fffffffffffffa18));
                              if (!(bool)in_stack_fffffffffffffa9b) {
                                CLI::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)&local_270,0);
                                in_stack_fffffffffffffa9a =
                                     std::operator==(in_stack_fffffffffffffa20,
                                                     (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                      in_stack_fffffffffffffa18));
                                if ((bool)in_stack_fffffffffffffa9a) {
                                  CLI::std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)&local_270,1);
                                  std::__cxx11::string::operator_cast_to_basic_string_view
                                            (in_stack_fffffffffffffa20);
                                  str_05._M_str = (char *)in_stack_fffffffffffffa68;
                                  str_05._M_len = (size_t)in_stack_fffffffffffffa60;
                                  gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_05);
                                  std::__cxx11::string::operator_cast_to_basic_string_view
                                            (in_stack_fffffffffffffa20);
                                  captureDesc._M_len._4_4_ = in_stack_fffffffffffffa1c;
                                  captureDesc._M_len._0_4_ = in_stack_fffffffffffffa18;
                                  captureDesc._M_str = (char *)in_stack_fffffffffffffa20;
                                  addCapture((Tracer *)0x413e60,captureDesc);
                                  std::__cxx11::string::~string(in_stack_fffffffffffffa20);
                                }
                                else {
                                  CLI::std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)&local_270,0);
                                  in_stack_fffffffffffffa99 =
                                       std::operator==(in_stack_fffffffffffffa20,
                                                       (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                                        in_stack_fffffffffffffa18));
                                  if ((bool)in_stack_fffffffffffffa99) {
                                    CLI::std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_270,1);
                                    std::__cxx11::string::operator_cast_to_basic_string_view
                                              (in_stack_fffffffffffffa20);
                                    str_06._M_str = (char *)in_stack_fffffffffffffa68;
                                    str_06._M_len = (size_t)in_stack_fffffffffffffa60;
                                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_06);
                                    std::__cxx11::string::operator_cast_to_basic_string_view
                                              (in_stack_fffffffffffffa20);
                                    sourceEndpoint_00._M_str._0_4_ = in_stack_fffffffffffffa70;
                                    sourceEndpoint_00._M_len = (size_t)in_stack_fffffffffffffa68;
                                    sourceEndpoint_00._M_str._4_1_ = in_stack_fffffffffffffa74;
                                    sourceEndpoint_00._M_str._5_1_ = in_stack_fffffffffffffa75;
                                    sourceEndpoint_00._M_str._6_1_ = in_stack_fffffffffffffa76;
                                    sourceEndpoint_00._M_str._7_1_ = in_stack_fffffffffffffa77;
                                    addSourceEndpointClone
                                              (in_stack_fffffffffffffa60,sourceEndpoint_00);
                                    std::__cxx11::string::~string(in_stack_fffffffffffffa20);
                                    CLI::std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_270,1);
                                    std::__cxx11::string::operator_cast_to_basic_string_view
                                              (in_stack_fffffffffffffa20);
                                    str_07._M_str = (char *)in_stack_fffffffffffffa68;
                                    str_07._M_len = (size_t)in_stack_fffffffffffffa60;
                                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_07);
                                    std::__cxx11::string::operator_cast_to_basic_string_view
                                              (in_stack_fffffffffffffa20);
                                    destEndpoint_00._M_str._0_4_ = in_stack_fffffffffffffa70;
                                    destEndpoint_00._M_len = (size_t)in_stack_fffffffffffffa68;
                                    destEndpoint_00._M_str._4_1_ = in_stack_fffffffffffffa74;
                                    destEndpoint_00._M_str._5_1_ = in_stack_fffffffffffffa75;
                                    destEndpoint_00._M_str._6_1_ = in_stack_fffffffffffffa76;
                                    destEndpoint_00._M_str._7_1_ = in_stack_fffffffffffffa77;
                                    addDestEndpointClone(in_stack_fffffffffffffa60,destEndpoint_00);
                                    std::__cxx11::string::~string(in_stack_fffffffffffffa20);
                                  }
                                  else {
                                    in_stack_fffffffffffffa90 =
                                         (Tracer *)
                                         std::operator<<((ostream *)&std::cerr,
                                                         "Unable to process line ");
                                    poVar5 = (ostream *)
                                             std::ostream::operator<<
                                                       (in_stack_fffffffffffffa90,local_23c);
                                    poVar5 = std::operator<<(poVar5,':');
                                    poVar5 = std::operator<<(poVar5,local_238);
                                    std::operator<<(poVar5,'\n');
                                  }
                                }
                                goto LAB_00414432;
                              }
                            }
                          }
                          CLI::std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&local_270,1);
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    (in_stack_fffffffffffffa20);
                          str_04._M_str = (char *)in_stack_fffffffffffffa68;
                          str_04._M_len = (size_t)in_stack_fffffffffffffa60;
                          gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_04);
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    (in_stack_fffffffffffffa20);
                          destEndpoint._M_str._0_4_ = in_stack_fffffffffffffa70;
                          destEndpoint._M_len = (size_t)in_stack_fffffffffffffa68;
                          destEndpoint._M_str._4_1_ = in_stack_fffffffffffffa74;
                          destEndpoint._M_str._5_1_ = in_stack_fffffffffffffa75;
                          destEndpoint._M_str._6_1_ = in_stack_fffffffffffffa76;
                          destEndpoint._M_str._7_1_ = in_stack_fffffffffffffa77;
                          addDestEndpointClone(in_stack_fffffffffffffa60,destEndpoint);
                          std::__cxx11::string::~string(in_stack_fffffffffffffa20);
                          goto LAB_00414432;
                        }
                      }
                    }
                    CLI::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_270,1);
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffa20);
                    str_03._M_str = (char *)in_stack_fffffffffffffa68;
                    str_03._M_len = (size_t)in_stack_fffffffffffffa60;
                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_03);
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffa20);
                    sourceEndpoint._M_str._0_4_ = in_stack_fffffffffffffa70;
                    sourceEndpoint._M_len = (size_t)in_stack_fffffffffffffa68;
                    sourceEndpoint._M_str._4_1_ = in_stack_fffffffffffffa74;
                    sourceEndpoint._M_str._5_1_ = in_stack_fffffffffffffa75;
                    sourceEndpoint._M_str._6_1_ = in_stack_fffffffffffffa76;
                    sourceEndpoint._M_str._7_1_ = in_stack_fffffffffffffa77;
                    addSourceEndpointClone(in_stack_fffffffffffffa60,sourceEndpoint);
                    std::__cxx11::string::~string(in_stack_fffffffffffffa20);
                    goto LAB_00414432;
                  }
                }
              }
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_270,1);
              std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
              str_02._M_str = (char *)in_stack_fffffffffffffa68;
              str_02._M_len = (size_t)in_stack_fffffffffffffa60;
              gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_02);
              std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
              endpoint._M_str._0_4_ = in_stack_fffffffffffffa70;
              endpoint._M_len = (size_t)in_stack_fffffffffffffa68;
              endpoint._M_str._4_1_ = in_stack_fffffffffffffa74;
              endpoint._M_str._5_1_ = in_stack_fffffffffffffa75;
              endpoint._M_str._6_1_ = in_stack_fffffffffffffa76;
              endpoint._M_str._7_1_ = in_stack_fffffffffffffa77;
              addEndpoint(in_stack_fffffffffffffa60,endpoint);
              std::__cxx11::string::~string(in_stack_fffffffffffffa20);
              goto LAB_00414432;
            }
          }
        }
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_270,1);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
      str_01._M_str = (char *)in_stack_fffffffffffffa68;
      str_01._M_len = (size_t)in_stack_fffffffffffffa60;
      gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_01);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
      key_00._M_len._1_1_ = in_stack_fffffffffffffa99;
      key_00._M_len._0_1_ = in_stack_fffffffffffffa98;
      key_00._M_len._2_1_ = in_stack_fffffffffffffa9a;
      key_00._M_len._3_1_ = in_stack_fffffffffffffa9b;
      key_00._M_len._4_1_ = in_stack_fffffffffffffa9c;
      key_00._M_len._5_1_ = in_stack_fffffffffffffa9d;
      key_00._M_len._6_1_ = in_stack_fffffffffffffa9e;
      key_00._M_len._7_1_ = in_stack_fffffffffffffa9f;
      key_00._M_str._0_1_ = in_stack_fffffffffffffaa0;
      key_00._M_str._1_1_ = in_stack_fffffffffffffaa1;
      key_00._M_str._2_1_ = in_stack_fffffffffffffaa2;
      key_00._M_str._3_1_ = in_stack_fffffffffffffaa3;
      key_00._M_str._4_1_ = in_stack_fffffffffffffaa4;
      key_00._M_str._5_1_ = in_stack_fffffffffffffaa5;
      key_00._M_str._6_1_ = in_stack_fffffffffffffaa6;
      key_00._M_str._7_1_ = in_stack_fffffffffffffaa7;
      addSubscription(in_stack_fffffffffffffa90,key_00);
      std::__cxx11::string::~string(in_stack_fffffffffffffa20);
    }
    else if (sVar4 == 3) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_270,0);
      in_stack_fffffffffffffa77 =
           std::operator==(in_stack_fffffffffffffa20,
                           (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      if ((bool)in_stack_fffffffffffffa77) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_270,1);
        in_stack_fffffffffffffa76 =
             std::operator==(in_stack_fffffffffffffa20,
                             (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
        if (!(bool)in_stack_fffffffffffffa76) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_270,1);
          in_stack_fffffffffffffa75 =
               std::operator==(in_stack_fffffffffffffa20,
                               (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18)
                              );
          if (!(bool)in_stack_fffffffffffffa75) {
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_270,1);
            in_stack_fffffffffffffa74 =
                 std::operator==(in_stack_fffffffffffffa20,
                                 (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                  in_stack_fffffffffffffa18));
            if (!(bool)in_stack_fffffffffffffa74) {
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_270,1);
              bVar1 = std::operator==(in_stack_fffffffffffffa20,
                                      (char *)CONCAT44(in_stack_fffffffffffffa1c,
                                                       in_stack_fffffffffffffa18));
              in_stack_fffffffffffffa70 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa70);
              if (!bVar1) {
                in_stack_fffffffffffffa68 =
                     std::operator<<((ostream *)&std::cerr,"Unable to process line ");
                in_stack_fffffffffffffa60 =
                     (Tracer *)std::ostream::operator<<(in_stack_fffffffffffffa68,local_23c);
                in_stack_fffffffffffffa58 =
                     std::operator<<((ostream *)in_stack_fffffffffffffa60,':');
                in_stack_fffffffffffffa50 = std::operator<<(in_stack_fffffffffffffa58,local_238);
                std::operator<<(in_stack_fffffffffffffa50,'\n');
                goto LAB_00414432;
              }
            }
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_270,2);
            std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
            str_09._M_str = (char *)in_stack_fffffffffffffa68;
            str_09._M_len = (size_t)in_stack_fffffffffffffa60;
            gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_09);
            std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
            destEndpoint_01._M_str._0_4_ = in_stack_fffffffffffffa70;
            destEndpoint_01._M_len = (size_t)in_stack_fffffffffffffa68;
            destEndpoint_01._M_str._4_1_ = in_stack_fffffffffffffa74;
            destEndpoint_01._M_str._5_1_ = in_stack_fffffffffffffa75;
            destEndpoint_01._M_str._6_1_ = in_stack_fffffffffffffa76;
            destEndpoint_01._M_str._7_1_ = in_stack_fffffffffffffa77;
            addDestEndpointClone(in_stack_fffffffffffffa60,destEndpoint_01);
            std::__cxx11::string::~string(in_stack_fffffffffffffa20);
            goto LAB_00414432;
          }
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_270,2);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
        str_08._M_str = (char *)in_stack_fffffffffffffa68;
        str_08._M_len = (size_t)in_stack_fffffffffffffa60;
        gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_08);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa20);
        sourceEndpoint_01._M_str._0_4_ = in_stack_fffffffffffffa70;
        sourceEndpoint_01._M_len = (size_t)in_stack_fffffffffffffa68;
        sourceEndpoint_01._M_str._4_1_ = in_stack_fffffffffffffa74;
        sourceEndpoint_01._M_str._5_1_ = in_stack_fffffffffffffa75;
        sourceEndpoint_01._M_str._6_1_ = in_stack_fffffffffffffa76;
        sourceEndpoint_01._M_str._7_1_ = in_stack_fffffffffffffa77;
        addSourceEndpointClone(in_stack_fffffffffffffa60,sourceEndpoint_01);
        std::__cxx11::string::~string(in_stack_fffffffffffffa20);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Unable to process line ");
        in_stack_fffffffffffffa40 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::ostream::operator<<(poVar5,local_23c);
        in_stack_fffffffffffffa38 = std::operator<<((ostream *)in_stack_fffffffffffffa40,':');
        in_stack_fffffffffffffa30 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(in_stack_fffffffffffffa38,local_238);
        std::operator<<((ostream *)in_stack_fffffffffffffa30,'\n');
      }
    }
LAB_00414432:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa30);
  } while( true );
}

Assistant:

void Tracer::loadTextFile(const std::string& textFile)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT
    App::loadTextFile(textFile);
    std::ifstream infile(textFile);
    std::string str;
    int lineCount = 0;
    while (std::getline(infile, str)) {
        ++lineCount;
        if (str.empty()) {
            continue;
        }
        auto firstChar = str.find_first_not_of(" \t\n\r\0");
        if ((firstChar == std::string::npos) || (str[firstChar] == '#') ||
            (str[firstChar] == '!')) {
            continue;
        }
        auto blk = splitlineQuotes(str, ",\t ", default_quote_chars, delimiter_compression::on);

        switch (blk.size()) {
            case 1:
                addSubscription(removeQuotes(blk[0]));
                break;
            case 2:
                if ((blk[0] == "subscription") || (blk[0] == "s") || (blk[0] == "sub") ||
                    (blk[0] == "tag")) {
                    addSubscription(removeQuotes(blk[1]));
                } else if ((blk[0] == "endpoint") || (blk[0] == "ept") || (blk[0] == "e")) {
                    addEndpoint(removeQuotes(blk[1]));
                } else if ((blk[0] == "sourceclone") || (blk[0] == "source") || (blk[0] == "src")) {
                    addSourceEndpointClone(removeQuotes(blk[1]));
                } else if ((blk[0] == "destclone") || (blk[0] == "dest") ||
                           (blk[0] == "destination")) {
                    addDestEndpointClone(removeQuotes(blk[1]));
                } else if (blk[0] == "capture") {
                    addCapture(removeQuotes(blk[1]));
                } else if (blk[0] == "clone") {
                    addSourceEndpointClone(removeQuotes(blk[1]));
                    addDestEndpointClone(removeQuotes(blk[1]));
                } else {
                    std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                }
                break;
            case 3:
                if (blk[0] == "clone") {
                    if ((blk[1] == "source") || (blk[1] == "src")) {
                        addSourceEndpointClone(removeQuotes(blk[2]));
                    } else if ((blk[1] == "dest") || (blk[1] == "destination")) {
                        addDestEndpointClone(removeQuotes(blk[2]));
                    } else {
                        std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                    }
                } else {
                    std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                }
                break;
            default:
                break;
        }
    }
    infile.close();
}